

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O1

FileDescriptor * unshield_get_file_descriptor(Unshield *unshield,int index)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Header *pHVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined8 uVar14;
  long lVar15;
  FileDescriptor **ppFVar16;
  FileDescriptor *pFVar17;
  ulong uVar18;
  long lVar19;
  
  if (-1 < index) {
    uVar10 = (ulong)(uint)index;
    pHVar7 = unshield->header_list;
    uVar3 = (pHVar7->cab).file_count;
    if (index < (int)uVar3) {
      if (pHVar7->file_descriptors == (FileDescriptor **)0x0) {
        ppFVar16 = (FileDescriptor **)calloc((ulong)uVar3,8);
        pHVar7->file_descriptors = ppFVar16;
      }
      if (pHVar7->file_descriptors[uVar10] == (FileDescriptor *)0x0) {
        pFVar17 = (FileDescriptor *)calloc(1,0x48);
        if ((pHVar7->major_version == 5) || (pHVar7->major_version == 0)) {
          puVar8 = pHVar7->data;
          lVar15 = (ulong)(pHVar7->cab).file_table_offset +
                   (ulong)(pHVar7->common).cab_descriptor_offset;
          uVar18 = (ulong)pHVar7->file_table[(pHVar7->cab).directory_count + index];
          lVar19 = uVar18 + lVar15;
          _unshield_log(3,"unshield_read_file_descriptor",0x36,"File descriptor offset %i: %08x",
                        uVar10,lVar19);
          pFVar17->volume = (uint16_t)pHVar7->index;
          pFVar17->name_offset = *(uint32_t *)(puVar8 + uVar18 + lVar15);
          uVar3 = *(uint *)(puVar8 + uVar18 + 4 + lVar15);
          pFVar17->directory_index = uVar3;
          uVar2 = *(ushort *)(puVar8 + uVar18 + 8 + lVar15);
          pFVar17->flags = uVar2;
          uVar4 = *(uint *)(puVar8 + uVar18 + 10 + lVar15);
          pFVar17->expanded_size = (ulong)uVar4;
          uVar5 = *(uint *)(puVar8 + uVar18 + 0xe + lVar15);
          pFVar17->compressed_size = (ulong)uVar5;
          uVar6 = *(uint *)(puVar8 + uVar18 + 0x26 + lVar15);
          pFVar17->data_offset = (ulong)uVar6;
          _unshield_log(3,"unshield_read_file_descriptor",0x46,"Name offset:      %08x");
          _unshield_log(3,"unshield_read_file_descriptor",0x47,"Directory index:  %08x",(ulong)uVar3
                       );
          _unshield_log(3,"unshield_read_file_descriptor",0x48,"Flags:            %04x",(ulong)uVar2
                       );
          _unshield_log(3,"unshield_read_file_descriptor",0x49,"Expanded size:    %08x",(ulong)uVar4
                       );
          _unshield_log(3,"unshield_read_file_descriptor",0x4a,"Compressed size:  %08x",(ulong)uVar5
                       );
          _unshield_log(3,"unshield_read_file_descriptor",0x4b,"Data offset:      %08x",(ulong)uVar6
                       );
          if (pHVar7->major_version == 5) {
            uVar14 = *(undefined8 *)(puVar8 + lVar19 + 0x32);
            *(undefined8 *)pFVar17->md5 = *(undefined8 *)(puVar8 + lVar19 + 0x2a);
            *(undefined8 *)(pFVar17->md5 + 8) = uVar14;
          }
        }
        else {
          puVar9 = pHVar7->data;
          lVar15 = (ulong)(pHVar7->cab).file_table_offset2 + (ulong)(pHVar7->cab).file_table_offset
                   + (ulong)(pHVar7->common).cab_descriptor_offset;
          lVar19 = uVar10 * 0x57;
          _unshield_log(3,"unshield_read_file_descriptor",0x66,"File descriptor offset: %08x",
                        lVar19 + lVar15);
          pFVar17->flags = *(uint16_t *)(puVar9 + lVar19 + lVar15);
          pFVar17->expanded_size = *(uint64_t *)(puVar9 + lVar19 + 2 + lVar15);
          pFVar17->compressed_size = *(uint64_t *)(puVar9 + lVar19 + 10 + lVar15);
          pFVar17->data_offset = *(uint64_t *)(puVar9 + lVar19 + 0x12 + lVar15);
          puVar8 = puVar9 + lVar19 + 0x1a + lVar15;
          uVar11 = *(undefined4 *)(puVar8 + 4);
          uVar12 = *(undefined4 *)(puVar8 + 8);
          uVar13 = *(undefined4 *)(puVar8 + 0xc);
          *(undefined4 *)pFVar17->md5 = *(undefined4 *)puVar8;
          *(undefined4 *)(pFVar17->md5 + 4) = uVar11;
          *(undefined4 *)(pFVar17->md5 + 8) = uVar12;
          *(undefined4 *)(pFVar17->md5 + 0xc) = uVar13;
          pFVar17->name_offset = *(uint32_t *)(puVar9 + lVar19 + 0x3a + lVar15);
          pFVar17->directory_index = (uint)*(ushort *)(puVar9 + lVar19 + 0x3e + lVar15);
          uVar3 = *(uint *)(puVar9 + lVar19 + 0x4c + lVar15);
          pFVar17->link_previous = uVar3;
          uVar4 = *(uint *)(puVar9 + lVar19 + 0x50 + lVar15);
          pFVar17->link_next = uVar4;
          bVar1 = puVar9[lVar19 + 0x54 + lVar15];
          pFVar17->link_flags = bVar1;
          if (bVar1 != 0) {
            _unshield_log(3,"unshield_read_file_descriptor",0x7c,
                          "Link: previous=%i, next=%i, flags=%i",(ulong)uVar3,(ulong)uVar4,
                          (uint)bVar1);
          }
          pFVar17->volume = *(uint16_t *)(puVar9 + lVar19 + lVar15 + 0x55);
        }
        if (((pFVar17->flags & 4) == 0) && (pFVar17->compressed_size != pFVar17->expanded_size)) {
          _unshield_log(2,"unshield_read_file_descriptor",0x8a,
                        "File is not compressed but compressed size is %08x and expanded size is %08x"
                       );
        }
        pHVar7->file_descriptors[uVar10] = pFVar17;
      }
      return pHVar7->file_descriptors[uVar10];
    }
  }
  _unshield_log(1,"unshield_get_file_descriptor",0x97,"Invalid index");
  return (FileDescriptor *)0x0;
}

Assistant:

static FileDescriptor* unshield_get_file_descriptor(Unshield* unshield, int index)
{
  /* XXX: multi-volume support... */
  Header* header = unshield->header_list;

  if (index < 0 || index >= (int)header->cab.file_count)
  {
    unshield_error("Invalid index");
    return NULL;
  }

  if (!header->file_descriptors)
    header->file_descriptors = calloc(header->cab.file_count, sizeof(FileDescriptor*));

  if (!header->file_descriptors[index])
    header->file_descriptors[index] = unshield_read_file_descriptor(unshield, index);

  return header->file_descriptors[index];
}